

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128>::on_num
          (int_writer<fmt::v7::detail::buffer_appender<char>,_char,_unsigned___int128> *this)

{
  unsigned___int128 *puVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  locale *plVar5;
  basic_format_specs<char> *pbVar6;
  undefined1 auVar7 [16];
  unsigned___int128 uVar8;
  char cVar9;
  uint uVar10;
  numpunct *pnVar11;
  buffer_appender<char> bVar12;
  int iVar13;
  long *plVar14;
  buffer<char> *buf;
  char *pcVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  long *local_298;
  long local_290;
  long local_288;
  char acStack_27a [50];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  (**(code **)(*(long *)pnVar11 + 0x20))(&local_298,pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (local_290 == 0) {
    on_dec(this);
    goto LAB_00118de4;
  }
  plVar5 = (locale *)(this->locale).locale_;
  if (plVar5 == (locale *)0x0) {
    std::locale::locale((locale *)&local_248);
  }
  else {
    std::locale::locale((locale *)&local_248,plVar5);
  }
  pnVar11 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_248);
  cVar9 = (**(code **)(*(long *)pnVar11 + 0x18))(pnVar11);
  std::locale::~locale((locale *)&local_248);
  if (cVar9 == '\0') {
    on_dec(this);
    goto LAB_00118de4;
  }
  puVar1 = &this->abs_value;
  uVar8 = *puVar1;
  uVar22 = *(ulong *)((long)&this->abs_value + 8);
  auVar7 = (undefined1  [16])*puVar1;
  auVar24 = (undefined1  [16])*puVar1;
  uVar16 = 1;
  if (((ulong)uVar8 < 10) <= uVar22) {
    uVar16 = 4;
    auVar23 = auVar24;
    do {
      uVar19 = auVar23._8_8_;
      uVar21 = auVar23._0_8_;
      iVar13 = (int)uVar16;
      if (uVar19 == 0 && (ulong)(99 < uVar21) <= -uVar19) {
        uVar16 = (ulong)(iVar13 - 2);
        goto LAB_00118b2d;
      }
      if (uVar19 == 0 && (ulong)(999 < uVar21) <= -uVar19) {
        uVar16 = (ulong)(iVar13 - 1);
        goto LAB_00118b2d;
      }
      if (uVar19 < (uVar21 < 10000)) goto LAB_00118b2d;
      auVar23 = __udivti3(uVar21,uVar19,10000,0);
      uVar16 = (ulong)(iVar13 + 4);
    } while (uVar19 != 0 || -uVar19 < (ulong)(99999 < uVar21));
    uVar16 = (ulong)(iVar13 + 1);
  }
LAB_00118b2d:
  iVar13 = (int)uVar16;
  plVar14 = local_298;
  uVar19 = uVar16;
  uVar21 = uVar16;
  if (local_290 == 0) {
LAB_00118b74:
    iVar17 = (int)uVar21;
    uVar10 = (uint)uVar19;
    if (plVar14 == (long *)((long)local_298 + local_290)) goto LAB_00118b7f;
  }
  else {
    iVar17 = (int)local_290 + iVar13;
    lVar18 = local_290;
    do {
      cVar3 = (char)*plVar14;
      uVar10 = (int)uVar19 - (int)cVar3;
      if ((uVar10 == 0 || (int)uVar19 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82))
      goto LAB_00118b74;
      uVar21 = (ulong)((int)uVar21 + 1);
      plVar14 = (long *)((long)plVar14 + 1);
      uVar19 = (ulong)uVar10;
      lVar18 = lVar18 + -1;
    } while (lVar18 != 0);
LAB_00118b7f:
    iVar17 = (int)(uVar10 - 1) / (int)*(char *)((long)local_298 + local_290 + -1) + iVar17;
  }
  pcVar15 = acStack_27a + (long)iVar13 + 2;
  pcVar20 = pcVar15;
  if (((ulong)uVar8 < 100) <= uVar22) {
    do {
      lVar18 = auVar24._8_8_;
      uVar22 = auVar24._0_8_;
      pcVar15 = pcVar20 + -2;
      auVar24 = __udivti3(uVar22,lVar18,100,0);
      *(undefined2 *)(pcVar20 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (uVar22 + auVar24._0_8_ * -100) * 2);
      pcVar20 = pcVar15;
      auVar7 = auVar24;
    } while (lVar18 != 0 || (ulong)-lVar18 < (ulong)(9999 < uVar22));
  }
  if (auVar7._8_8_ == 0 && (ulong)(9 < auVar7._0_8_) <= (ulong)-auVar7._8_8_) {
    pcVar15[-1] = auVar7[0] | 0x30;
  }
  else {
    *(undefined2 *)(pcVar15 + -2) = *(undefined2 *)(basic_data<void>::digits + auVar7._0_8_ * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00137960;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar10 = iVar17 + this->prefix_size;
  uVar22 = (ulong)uVar10;
  if (500 < uVar10) {
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,uVar22);
  }
  pcVar15 = local_248.super_buffer<char>.ptr_;
  local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
  if (uVar22 <= local_248.super_buffer<char>.capacity_) {
    local_248.super_buffer<char>.size_ = uVar22;
  }
  pcVar20 = local_248.super_buffer<char>.ptr_ + (long)(int)uVar10 + -1;
  if (1 < iVar13) {
    uVar16 = uVar16 + 1;
    iVar13 = 0;
    plVar14 = local_298;
    do {
      pcVar2 = pcVar20 + -1;
      *pcVar20 = acStack_27a[uVar16];
      cVar3 = (char)*plVar14;
      if ('\0' < cVar3) {
        iVar13 = iVar13 + 1;
        if ((cVar3 != '\x7f') && (iVar13 % (int)cVar3 == 0)) {
          if ((long *)((long)plVar14 + 1) != (long *)((long)local_298 + local_290)) {
            iVar13 = 0;
            plVar14 = (long *)((long)plVar14 + 1);
          }
          pcVar20[-1] = cVar9;
          pcVar2 = pcVar20 + -2;
        }
      }
      pcVar20 = pcVar2;
      uVar16 = uVar16 - 1;
    } while (2 < uVar16);
  }
  *pcVar20 = acStack_27a[2];
  if (this->prefix_size != 0) {
    pcVar20[-1] = '-';
  }
  pbVar6 = this->specs;
  uVar16 = 0;
  if (uVar22 <= (uint)pbVar6->width) {
    uVar16 = (uint)pbVar6->width - uVar22;
  }
  bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
       (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  bVar4 = *(byte *)((long)&basic_data<void>::right_padding_shifts +
                   (ulong)((byte)pbVar6->field_0x9 & 0xf));
  if (*(ulong *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + uVar22 + (pbVar6->fill).size_ * uVar16) {
    (*(code *)**(undefined8 **)
                bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  uVar22 = uVar16 >> (bVar4 & 0x3f);
  bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar22,&pbVar6->fill);
  bVar12 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                     (pcVar15,pcVar15 + (int)uVar10,bVar12);
  bVar12 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar12,uVar16 - uVar22,&pbVar6->fill);
  (this->out).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
       (buffer<char> *)bVar12.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
    operator_delete(local_248.super_buffer<char>.ptr_,local_248.super_buffer<char>.capacity_);
  }
LAB_00118de4:
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  return;
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }